

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::DisconnectNode(CConnman *this,NodeId id)

{
  long lVar1;
  pointer ppCVar2;
  CNode *pCVar3;
  long lVar4;
  bool bVar5;
  pointer ppCVar6;
  Logger *this_00;
  long in_FS_OFFSET;
  bool bVar7;
  string_view logging_function;
  string_view source_file;
  NodeId local_38;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock94;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock94.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  criticalblock94.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock94.super_unique_lock);
  ppCVar6 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar7 = ppCVar6 != ppCVar2;
  if (bVar7) {
    pCVar3 = *ppCVar6;
    lVar4 = pCVar3->id;
    while (lVar4 != id) {
      ppCVar6 = ppCVar6 + 1;
      bVar7 = ppCVar6 != ppCVar2;
      if (ppCVar6 == ppCVar2) goto LAB_001b36d1;
      pCVar3 = *ppCVar6;
      lVar4 = pCVar3->id;
    }
    this_00 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
    if (bVar5) {
      local_38 = pCVar3->id;
      logging_function._M_str = "DisconnectNode";
      logging_function._M_len = 0xe;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      LogPrintf_<long>(logging_function,source_file,0xe32,NET,Debug,
                       "disconnect by id peer=%d; disconnecting\n",&local_38);
    }
    LOCK();
    (pCVar3->fDisconnect)._M_base._M_i = true;
    UNLOCK();
  }
LAB_001b36d1:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock94.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(NodeId id)
{
    LOCK(m_nodes_mutex);
    for(CNode* pnode : m_nodes) {
        if (id == pnode->GetId()) {
            LogDebug(BCLog::NET, "disconnect by id peer=%d; disconnecting\n", pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}